

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

TCGv_i64 load_last_active(DisasContext_conflict1 *s,TCGv_i32 last,int rm,int esz)

{
  TCGContext_conflict1 *s_00;
  TCGTemp *ts;
  TCGv_i64 pTVar1;
  
  s_00 = s->uc->tcg_ctx;
  ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  tcg_gen_ext_i32_i64_aarch64(s_00,(TCGv_i64)((long)ts - (long)s_00),last);
  tcg_gen_op3_aarch64(s_00,INDEX_op_add_i64,(TCGArg)ts,(TCGArg)ts,
                      (TCGArg)(s_00->cpu_env + (long)s_00));
  pTVar1 = load_esz(s_00,(TCGv_ptr)((long)ts - (long)s_00),rm * 0x100 + 0xc10,esz);
  tcg_temp_free_internal_aarch64(s_00,ts);
  return pTVar1;
}

Assistant:

static TCGv_i64 load_last_active(DisasContext *s, TCGv_i32 last,
                                 int rm, int esz)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_ptr p = tcg_temp_new_ptr(tcg_ctx);
    TCGv_i64 r;

    /* Convert offset into vector into offset into ENV.
     * The final adjustment for the vector register base
     * is added via constant offset to the load.
     */
#ifdef HOST_WORDS_BIGENDIAN
    /* Adjust for element ordering.  See vec_reg_offset.  */
    if (esz < 3) {
        tcg_gen_xori_i32(tcg_ctx, last, last, 8 - (1 << esz));
    }
#endif
    tcg_gen_ext_i32_ptr(tcg_ctx, p, last);
    tcg_gen_add_ptr(tcg_ctx, p, p, tcg_ctx->cpu_env);

    r = load_esz(tcg_ctx, p, vec_full_reg_offset(s, rm), esz);
    tcg_temp_free_ptr(tcg_ctx, p);

    return r;
}